

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BlockStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BlockStatementSyntax,slang::syntax::BlockStatementSyntax_const&>
          (BumpAllocator *this,BlockStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  BlockStatementSyntax *pBVar8;
  
  pBVar8 = (BlockStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BlockStatementSyntax *)this->endPtr < pBVar8 + 1) {
    pBVar8 = (BlockStatementSyntax *)allocateSlow(this,0xc0,8);
  }
  else {
    this->head->current = (byte *)(pBVar8 + 1);
  }
  (pBVar8->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pBVar8->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pBVar8->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pBVar8->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pBVar8->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pBVar8->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pBVar8->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pBVar8->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar4;
  (pBVar8->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pBVar8->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00622e60;
  (pBVar8->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pBVar8->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pBVar8->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pBVar8->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00623138;
  uVar5 = (args->begin).field_0x2;
  NVar6.raw = (args->begin).numFlags.raw;
  uVar7 = (args->begin).rawLen;
  pIVar3 = (args->begin).info;
  (pBVar8->begin).kind = (args->begin).kind;
  (pBVar8->begin).field_0x2 = uVar5;
  (pBVar8->begin).numFlags = (NumericTokenFlags)NVar6.raw;
  (pBVar8->begin).rawLen = uVar7;
  (pBVar8->begin).info = pIVar3;
  pBVar8->blockName = args->blockName;
  uVar4 = *(undefined4 *)&(args->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (pBVar8->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pBVar8->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pBVar8->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pBVar8->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pBVar8->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00622e60;
  (pBVar8->items).super_SyntaxListBase.childCount = (args->items).super_SyntaxListBase.childCount;
  sVar2 = (args->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pBVar8->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr =
       (args->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr;
  (pBVar8->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pBVar8->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006239c0;
  uVar5 = (args->end).field_0x2;
  NVar6.raw = (args->end).numFlags.raw;
  uVar7 = (args->end).rawLen;
  pIVar3 = (args->end).info;
  (pBVar8->end).kind = (args->end).kind;
  (pBVar8->end).field_0x2 = uVar5;
  (pBVar8->end).numFlags = (NumericTokenFlags)NVar6.raw;
  (pBVar8->end).rawLen = uVar7;
  (pBVar8->end).info = pIVar3;
  pBVar8->endBlockName = args->endBlockName;
  return pBVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }